

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O0

void __thiscall
btSphereShape::getAabb(btSphereShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btTransform *in_RSI;
  long *in_RDI;
  btVector3 bVar1;
  btVector3 extent;
  btVector3 *center;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btVector3 local_38;
  btVector3 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = btTransform::getOrigin(in_RSI);
  local_3c = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_40 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_44 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  btVector3::btVector3(&local_38,&local_3c,&local_40,&local_44);
  bVar1 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *local_18 = bVar1.m_floats._0_8_;
  local_18[1] = bVar1.m_floats._8_8_;
  bVar1 = operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *local_20 = bVar1.m_floats._0_8_;
  local_20[1] = bVar1.m_floats._8_8_;
  return;
}

Assistant:

void btSphereShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	const btVector3& center = t.getOrigin();
	btVector3 extent(getMargin(),getMargin(),getMargin());
	aabbMin = center - extent;
	aabbMax = center + extent;
}